

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Eigen::Matrix<double,-1,-1,0,-1,-1>::
Matrix<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>>>
          (Matrix<double,__1,__1,_0,__1,__1> *this,
          ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>
          *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *dst;
  Index in_RSI;
  ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>
  *in_RDI;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *unaff_retaddr;
  ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>
  *nbRows;
  
  nbRows = in_RDI;
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::PlainObjectBase
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_RDI);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::_check_template_params();
  ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>_>_>
  ::rows((ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>
          *)0x2d215c);
  dst = (Matrix<double,__1,__1,_0,__1,__1> *)
        ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>_>_>
        ::cols((ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>
                *)0x2d216d);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (unaff_retaddr,(Index)nbRows,in_RSI);
  ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,5>>>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(in_RDI,dst);
  return;
}

Assistant:

EIGEN_STRONG_INLINE Matrix(const ReturnByValue<OtherDerived>& other)
    {
      Base::_check_template_params();
      Base::resize(other.rows(), other.cols());
      other.evalTo(*this);
    }